

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O1

void __thiscall
clip_model_loader::clip_model_loader(clip_model_loader *this,char *fname,clip_ctx *ctx_clip)

{
  gguf_context_ptr *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  undefined4 uVar6;
  pointer __p;
  pointer __p_00;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  runtime_error *this_01;
  ulong uVar12;
  uint local_c0;
  string description;
  string name;
  ggml_context *meta;
  string local_50;
  
  this_00 = &this->ctx_gguf;
  (this->ctx_meta)._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
  super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
  super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl = (ggml_context *)0x0;
  (this->ctx_gguf)._M_t.super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
  super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
  super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl = (gguf_context *)0x0;
  this->ctx_clip = ctx_clip;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->fname,fname,(allocator<char> *)&name);
  __p_00 = (pointer)gguf_init_from_file(fname,1);
  name._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<gguf_context,_gguf_context_deleter>::reset
            ((__uniq_ptr_impl<gguf_context,_gguf_context_deleter> *)this_00,__p_00);
  std::unique_ptr<gguf_context,_gguf_context_deleter>::~unique_ptr
            ((unique_ptr<gguf_context,_gguf_context_deleter> *)&name);
  if ((this_00->_M_t).super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
      super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
      super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl != (gguf_context *)0x0) {
    std::__uniq_ptr_impl<ggml_context,_ggml_context_deleter>::reset
              ((__uniq_ptr_impl<ggml_context,_ggml_context_deleter> *)this,(pointer)0x0);
    uVar7 = gguf_get_n_tensors((this->ctx_gguf)._M_t.
                               super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                               super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                               super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl);
    name._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    paVar1 = &description.field_2;
    description._M_dataplus._M_p = (pointer)paVar1;
    name._M_dataplus._M_p = (pointer)&name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&description,"general.name","");
    get_string(this,&description,&name,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)description._M_dataplus._M_p != paVar1) {
      operator_delete(description._M_dataplus._M_p,
                      CONCAT71(description.field_2._M_allocated_capacity._1_7_,
                               description.field_2._M_local_buf[0]) + 1);
    }
    description._M_string_length = 0;
    description.field_2._M_local_buf[0] = '\0';
    description._M_dataplus._M_p = (pointer)paVar1;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"general.description","");
    get_string(this,&local_50,&description,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((int)g_logger_state.verbosity_thold < 3) {
      clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: model name:   %s\n","clip_model_loader",
                        name._M_dataplus._M_p);
    }
    if ((int)g_logger_state.verbosity_thold < 3) {
      clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: description:  %s\n","clip_model_loader",
                        description._M_dataplus._M_p);
    }
    if ((int)g_logger_state.verbosity_thold < 3) {
      uVar5 = gguf_get_version((this_00->_M_t).
                               super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                               super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                               super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl);
      clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: GGUF version: %d\n","clip_model_loader",
                        (ulong)uVar5);
    }
    if ((int)g_logger_state.verbosity_thold < 3) {
      uVar8 = gguf_get_alignment((this_00->_M_t).
                                 super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                                 super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                                 super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl);
      clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: alignment:    %zu\n","clip_model_loader",uVar8);
    }
    if ((int)g_logger_state.verbosity_thold < 3) {
      clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_tensors:    %d\n","clip_model_loader",uVar7);
    }
    if ((int)g_logger_state.verbosity_thold < 3) {
      uVar5 = gguf_get_n_kv((this_00->_M_t).
                            super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                            super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl);
      clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_kv:         %d\n","clip_model_loader",
                        (ulong)uVar5);
    }
    if ((int)g_logger_state.verbosity_thold < 3) {
      clip_log_internal(GGML_LOG_LEVEL_INFO,"\n");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)description._M_dataplus._M_p != paVar1) {
      operator_delete(description._M_dataplus._M_p,
                      CONCAT71(description.field_2._M_allocated_capacity._1_7_,
                               description.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,
                      CONCAT71(name.field_2._M_allocated_capacity._1_7_,name.field_2._M_local_buf[0]
                              ) + 1);
    }
    local_c0 = (uint)uVar7;
    if (0 < (int)local_c0) {
      uVar12 = 0;
      do {
        uVar7 = gguf_get_tensor_name
                          ((this_00->_M_t).super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>
                           ._M_t.super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                           super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,uVar12);
        uVar8 = gguf_get_tensor_offset
                          ((this_00->_M_t).super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>
                           ._M_t.super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                           super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,uVar12);
        uVar6 = gguf_get_tensor_type
                          ((this_00->_M_t).super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>
                           ._M_t.super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                           super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,uVar12);
        lVar9 = ggml_get_tensor(0,uVar7);
        lVar10 = ggml_nbytes(lVar9);
        this->model_size = this->model_size + lVar10;
        if ((int)g_logger_state.verbosity_thold < 2) {
          uVar5 = ggml_n_dims(lVar9);
          uVar7 = *(undefined8 *)(lVar9 + 0x10);
          uVar2 = *(undefined8 *)(lVar9 + 0x18);
          uVar3 = *(undefined8 *)(lVar9 + 0x20);
          uVar4 = *(undefined8 *)(lVar9 + 0x28);
          uVar11 = ggml_type_name(uVar6);
          clip_log_internal(GGML_LOG_LEVEL_DEBUG,
                            "%s: tensor[%d]: n_dims = %d, name = %s, tensor_size=%zu, offset=%zu, shape:[%lu, %lu, %lu, %lu], type = %s\n"
                            ,"clip_model_loader",uVar12 & 0xffffffff,(ulong)uVar5,lVar9 + 0x100,
                            lVar10,uVar8,uVar7,uVar2,uVar3,uVar4,uVar11);
        }
        uVar12 = uVar12 + 1;
      } while ((local_c0 & 0x7fffffff) != uVar12);
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  string_format_abi_cxx11_
            (&name,"%s: failed to load CLIP model from %s. Does this file exist?\n",
             "clip_model_loader",fname);
  std::runtime_error::runtime_error(this_01,(string *)&name);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

clip_model_loader(const char * fname, clip_ctx & ctx_clip) : ctx_clip(ctx_clip), fname(fname) {
        struct ggml_context * meta = nullptr;

        struct gguf_init_params params = {
            /*.no_alloc = */ true,
            /*.ctx      = */ &meta,
        };

        ctx_gguf = gguf_context_ptr(gguf_init_from_file(fname, params));
        if (!ctx_gguf.get()) {
            throw std::runtime_error(string_format("%s: failed to load CLIP model from %s. Does this file exist?\n", __func__, fname));
        }

        ctx_meta.reset(meta);

        const int n_tensors = gguf_get_n_tensors(ctx_gguf.get());

        // print gguf info
        {
            std::string name;
            get_string(KEY_NAME, name, false);
            std::string description;
            get_string(KEY_DESCRIPTION, description, false);
            LOG_INF("%s: model name:   %s\n",  __func__, name.c_str());
            LOG_INF("%s: description:  %s\n",  __func__, description.c_str());
            LOG_INF("%s: GGUF version: %d\n",  __func__, gguf_get_version(ctx_gguf.get()));
            LOG_INF("%s: alignment:    %zu\n", __func__, gguf_get_alignment(ctx_gguf.get()));
            LOG_INF("%s: n_tensors:    %d\n",  __func__, n_tensors);
            LOG_INF("%s: n_kv:         %d\n",  __func__, (int)gguf_get_n_kv(ctx_gguf.get()));
            LOG_INF("\n");
        }

        // tensors
        {
            for (int i = 0; i < n_tensors; ++i) {
                const char * name = gguf_get_tensor_name(ctx_gguf.get(), i);
                const size_t offset = gguf_get_tensor_offset(ctx_gguf.get(), i);
                enum ggml_type type = gguf_get_tensor_type(ctx_gguf.get(), i);
                struct ggml_tensor * cur = ggml_get_tensor(meta, name);
                size_t tensor_size = ggml_nbytes(cur);
                model_size += tensor_size;
                LOG_DBG("%s: tensor[%d]: n_dims = %d, name = %s, tensor_size=%zu, offset=%zu, shape:[%" PRIu64 ", %" PRIu64 ", %" PRIu64 ", %" PRIu64 "], type = %s\n",
                    __func__, i, ggml_n_dims(cur), cur->name, tensor_size, offset, cur->ne[0], cur->ne[1], cur->ne[2], cur->ne[3], ggml_type_name(type));
            }
        }
    }